

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O3

int array_rangeop_getrange
              (t_array_rangeop *x,char **firstitemp,int *nitemp,int *stridep,int *arrayonsetp)

{
  int iVar1;
  int iVar2;
  _array *p_Var3;
  t_template *x_00;
  int iVar4;
  int iVar5;
  int type;
  int fieldonset;
  t_symbol *arraytype;
  _glist *glist;
  int local_48;
  int local_44;
  t_symbol *local_40;
  _glist *local_38;
  
  p_Var3 = array_client_getbuf(&x->x_tc,&local_38);
  if (p_Var3 == (_array *)0x0) {
    iVar2 = 0;
  }
  else {
    x_00 = template_findbyname(p_Var3->a_templatesym);
    iVar2 = template_find_field(x_00,x->x_elemfield,&local_44,&local_48,&local_40);
    if ((iVar2 == 0) || (local_48 != 0)) {
      iVar2 = 0;
      pd_error(x,"can\'t find field %s in struct %s",x->x_elemfield->s_name,
               p_Var3->a_templatesym->s_name);
    }
    else {
      iVar2 = (int)x->x_onset;
      if (iVar2 < 0) {
        iVar2 = 0;
      }
      else if (p_Var3->a_n < iVar2) {
        iVar2 = p_Var3->a_n;
      }
      iVar1 = p_Var3->a_elemsize;
      if (0.0 <= x->x_n) {
        iVar5 = (int)x->x_n;
        iVar4 = p_Var3->a_n - iVar2;
        if (iVar2 + iVar5 <= p_Var3->a_n) {
          iVar4 = iVar5;
        }
      }
      else {
        iVar4 = p_Var3->a_n - iVar2;
      }
      *firstitemp = p_Var3->a_vec + (long)(iVar2 * iVar1) + (long)local_44;
      *nitemp = iVar4;
      *stridep = iVar1;
      *arrayonsetp = iVar2;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int array_rangeop_getrange(t_array_rangeop *x,
    char **firstitemp, int *nitemp, int *stridep, int *arrayonsetp)
{
    t_glist *glist;
    t_array *a = array_client_getbuf(&x->x_tc, &glist);
    int stride, fieldonset, arrayonset, nitem, type;
    t_symbol *arraytype;
    t_template *template;
    if (!a)
        return (0);
    template = template_findbyname(a->a_templatesym);
    if (!template_find_field(template, x->x_elemfield, &fieldonset,
        &type, &arraytype) || type != DT_FLOAT)
    {
        pd_error(x, "can't find field %s in struct %s",
            x->x_elemfield->s_name, a->a_templatesym->s_name);
        return (0);
    }
    stride = a->a_elemsize;
    arrayonset = x->x_onset;
    if (arrayonset < 0)
        arrayonset = 0;
    else if (arrayonset > a->a_n)
        arrayonset = a->a_n;
    if (x->x_n < 0)
        nitem = a->a_n - arrayonset;
    else
    {
        nitem = x->x_n;
        if (nitem + arrayonset > a->a_n)
            nitem = a->a_n - arrayonset;
    }
    *firstitemp = a->a_vec+(fieldonset+arrayonset*stride);
    *nitemp = nitem;
    *stridep = stride;
    *arrayonsetp = arrayonset;
    return (1);
}